

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_draw_list_path_arc_to_fast
               (nk_draw_list *list,nk_vec2 center,float radius,int a_min,int a_max)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  nk_vec2 pos;
  int iVar3;
  nk_vec2 *pnVar4;
  ulong uVar5;
  
  if (list != (nk_draw_list *)0x0) {
    if (a_min <= a_max) {
      uVar5 = (ulong)a_min;
      pnVar4 = list->circle_vtx + uVar5;
      iVar3 = (a_max - a_min) + 1;
      do {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar5;
        uVar1 = *(undefined8 *)
                 ((long)pnVar4 +
                 (SUB168(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x3ffffffffffffff8) * -0xc);
        pos.y = (float)((ulong)uVar1 >> 0x20) * radius + center.y;
        pos.x = (float)uVar1 * radius + center.x;
        nk_draw_list_path_line_to(list,pos);
        uVar5 = uVar5 + 1;
        pnVar4 = pnVar4 + 1;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    return;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x26cc,
                "void nk_draw_list_path_arc_to_fast(struct nk_draw_list *, struct nk_vec2, float, int, int)"
               );
}

Assistant:

NK_API void
nk_draw_list_path_arc_to_fast(struct nk_draw_list *list, struct nk_vec2 center,
    float radius, int a_min, int a_max)
{
    int a = 0;
    NK_ASSERT(list);
    if (!list) return;
    if (a_min <= a_max) {
        for (a = a_min; a <= a_max; a++) {
            const struct nk_vec2 c = list->circle_vtx[(nk_size)a % NK_LEN(list->circle_vtx)];
            const float x = center.x + c.x * radius;
            const float y = center.y + c.y * radius;
            nk_draw_list_path_line_to(list, nk_vec2(x, y));
        }
    }
}